

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O1

upb_MiniTableField * upb_FieldDef_MiniTable(upb_FieldDef *f)

{
  upb_MiniTableExtension *puVar1;
  upb_MiniTable *puVar2;
  
  if (f->is_extension == true) {
    puVar1 = _upb_FileDef_ExtensionMiniTable(f->file,(uint)f->layout_index);
    return &puVar1->field_dont_copy_me__upb_internal_use_only;
  }
  puVar2 = upb_MessageDef_MiniTable(f->msgdef);
  return (upb_MiniTableField *)
         ((long)&puVar2->fields_dont_copy_me__upb_internal_use_only->
                 number_dont_copy_me__upb_internal_use_only + (ulong)((uint)f->layout_index * 0xc));
}

Assistant:

const upb_MiniTableField* upb_FieldDef_MiniTable(const upb_FieldDef* f) {
  if (upb_FieldDef_IsExtension(f)) {
    const upb_FileDef* file = upb_FieldDef_File(f);
    return (upb_MiniTableField*)_upb_FileDef_ExtensionMiniTable(
        file, f->layout_index);
  } else {
    const upb_MiniTable* layout = upb_MessageDef_MiniTable(f->msgdef);
    return &layout->UPB_PRIVATE(fields)[f->layout_index];
  }
}